

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QObject*,QPointer<QHttp2Stream>>::emplaceValue<QPointer<QHttp2Stream>>
          (Node<QObject_*,_QPointer<QHttp2Stream>_> *this,QPointer<QHttp2Stream> *args)

{
  QPointer<QHttp2Stream> *in_RDI;
  long in_FS_OFFSET;
  QPointer<QHttp2Stream> *this_00;
  QPointer<QHttp2Stream> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_18;
  QPointer<QHttp2Stream>::QPointer(this_00,in_RDI);
  QPointer<QHttp2Stream>::operator=(this_00,in_RDI);
  QPointer<QHttp2Stream>::~QPointer((QPointer<QHttp2Stream> *)0x2e10a9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }